

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

char * idToVersion(PolicyID id)

{
  char *pcStack_10;
  PolicyID id_local;
  
  switch(id) {
  case CMP0000:
    pcStack_10 = "2.6.0";
    break;
  case CMP0001:
    pcStack_10 = "2.6.0";
    break;
  case CMP0002:
    pcStack_10 = "2.6.0";
    break;
  case CMP0003:
    pcStack_10 = "2.6.0";
    break;
  case CMP0004:
    pcStack_10 = "2.6.0";
    break;
  case CMP0005:
    pcStack_10 = "2.6.0";
    break;
  case CMP0006:
    pcStack_10 = "2.6.0";
    break;
  case CMP0007:
    pcStack_10 = "2.6.0";
    break;
  case CMP0008:
    pcStack_10 = "2.6.1";
    break;
  case CMP0009:
    pcStack_10 = "2.6.2";
    break;
  case CMP0010:
    pcStack_10 = "2.6.3";
    break;
  case CMP0011:
    pcStack_10 = "2.6.3";
    break;
  case CMP0012:
    pcStack_10 = "2.8.0";
    break;
  case CMP0013:
    pcStack_10 = "2.8.0";
    break;
  case CMP0014:
    pcStack_10 = "2.8.0";
    break;
  case CMP0015:
    pcStack_10 = "2.8.1";
    break;
  case CMP0016:
    pcStack_10 = "2.8.3";
    break;
  case CMP0017:
    pcStack_10 = "2.8.4";
    break;
  case CMP0018:
    pcStack_10 = "2.8.9";
    break;
  case CMP0019:
    pcStack_10 = "2.8.11";
    break;
  case CMP0020:
    pcStack_10 = "2.8.11";
    break;
  case CMP0021:
    pcStack_10 = "2.8.12";
    break;
  case CMP0022:
    pcStack_10 = "2.8.12";
    break;
  case CMP0023:
    pcStack_10 = "2.8.12";
    break;
  case CMP0024:
    pcStack_10 = "3.0.0";
    break;
  case CMP0025:
    pcStack_10 = "3.0.0";
    break;
  case CMP0026:
    pcStack_10 = "3.0.0";
    break;
  case CMP0027:
    pcStack_10 = "3.0.0";
    break;
  case CMP0028:
    pcStack_10 = "3.0.0";
    break;
  case CMP0029:
    pcStack_10 = "3.0.0";
    break;
  case CMP0030:
    pcStack_10 = "3.0.0";
    break;
  case CMP0031:
    pcStack_10 = "3.0.0";
    break;
  case CMP0032:
    pcStack_10 = "3.0.0";
    break;
  case CMP0033:
    pcStack_10 = "3.0.0";
    break;
  case CMP0034:
    pcStack_10 = "3.0.0";
    break;
  case CMP0035:
    pcStack_10 = "3.0.0";
    break;
  case CMP0036:
    pcStack_10 = "3.0.0";
    break;
  case CMP0037:
    pcStack_10 = "3.0.0";
    break;
  case CMP0038:
    pcStack_10 = "3.0.0";
    break;
  case CMP0039:
    pcStack_10 = "3.0.0";
    break;
  case CMP0040:
    pcStack_10 = "3.0.0";
    break;
  case CMP0041:
    pcStack_10 = "3.0.0";
    break;
  case CMP0042:
    pcStack_10 = "3.0.0";
    break;
  case CMP0043:
    pcStack_10 = "3.0.0";
    break;
  case CMP0044:
    pcStack_10 = "3.0.0";
    break;
  case CMP0045:
    pcStack_10 = "3.0.0";
    break;
  case CMP0046:
    pcStack_10 = "3.0.0";
    break;
  case CMP0047:
    pcStack_10 = "3.0.0";
    break;
  case CMP0048:
    pcStack_10 = "3.0.0";
    break;
  case CMP0049:
    pcStack_10 = "3.0.0";
    break;
  case CMP0050:
    pcStack_10 = "3.0.0";
    break;
  case CMP0051:
    pcStack_10 = "3.1.0";
    break;
  case CMP0052:
    pcStack_10 = "3.1.0";
    break;
  case CMP0053:
    pcStack_10 = "3.1.0";
    break;
  case CMP0054:
    pcStack_10 = "3.1.0";
    break;
  case CMP0055:
    pcStack_10 = "3.2.0";
    break;
  case CMP0056:
    pcStack_10 = "3.2.0";
    break;
  case CMP0057:
    pcStack_10 = "3.3.0";
    break;
  case CMP0058:
    pcStack_10 = "3.3.0";
    break;
  case CMP0059:
    pcStack_10 = "3.3.0";
    break;
  case CMP0060:
    pcStack_10 = "3.3.0";
    break;
  case CMP0061:
    pcStack_10 = "3.3.0";
    break;
  case CMP0062:
    pcStack_10 = "3.3.0";
    break;
  case CMP0063:
    pcStack_10 = "3.3.0";
    break;
  case CMP0064:
    pcStack_10 = "3.4.0";
    break;
  case CMP0065:
    pcStack_10 = "3.4.0";
    break;
  case CMP0066:
    pcStack_10 = "3.7.0";
    break;
  case CMP0067:
    pcStack_10 = "3.8.0";
    break;
  case CMP0068:
    pcStack_10 = "3.9.0";
    break;
  case CMP0069:
    pcStack_10 = "3.9.0";
    break;
  case CMP0070:
    pcStack_10 = "3.10.0";
    break;
  case CMP0071:
    pcStack_10 = "3.10.0";
    break;
  case CMP0072:
    pcStack_10 = "3.11.0";
    break;
  case CMP0073:
    pcStack_10 = "3.12.0";
    break;
  case CMP0074:
    pcStack_10 = "3.12.0";
    break;
  case CMP0075:
    pcStack_10 = "3.12.0";
    break;
  case CMP0076:
    pcStack_10 = "3.13.0";
    break;
  case CMP0077:
    pcStack_10 = "3.13.0";
    break;
  case CMP0078:
    pcStack_10 = "3.13.0";
    break;
  case CMP0079:
    pcStack_10 = "3.13.0";
    break;
  case CMP0080:
    pcStack_10 = "3.13.0";
    break;
  case CMP0081:
    pcStack_10 = "3.13.0";
    break;
  case CMP0082:
    pcStack_10 = "3.14.0";
    break;
  case CMP0083:
    pcStack_10 = "3.14.0";
    break;
  case CMP0084:
    pcStack_10 = "3.14.0";
    break;
  case CMP0085:
    pcStack_10 = "3.14.0";
    break;
  case CMP0086:
    pcStack_10 = "3.14.0";
    break;
  case CMP0087:
    pcStack_10 = "3.14.0";
    break;
  case CMP0088:
    pcStack_10 = "3.14.0";
    break;
  case CMP0089:
    pcStack_10 = "3.15.0";
    break;
  case CMP0090:
    pcStack_10 = "3.15.0";
    break;
  case CMP0091:
    pcStack_10 = "3.15.0";
    break;
  case CMP0092:
    pcStack_10 = "3.15.0";
    break;
  case CMP0093:
    pcStack_10 = "3.15.0";
    break;
  case CMP0094:
    pcStack_10 = "3.15.0";
    break;
  case CMP0095:
    pcStack_10 = "3.16.0";
    break;
  case CMP0096:
    pcStack_10 = "3.16.0";
    break;
  case CMP0097:
    pcStack_10 = "3.16.0";
    break;
  case CMP0098:
    pcStack_10 = "3.17.0";
    break;
  case CMP0099:
    pcStack_10 = "3.17.0";
    break;
  case CMP0100:
    pcStack_10 = "3.17.0";
    break;
  case CMP0101:
    pcStack_10 = "3.17.0";
    break;
  case CMP0102:
    pcStack_10 = "3.17.0";
    break;
  case CMP0103:
    pcStack_10 = "3.18.0";
    break;
  case CMP0104:
    pcStack_10 = "3.18.0";
    break;
  case CMP0105:
    pcStack_10 = "3.18.0";
    break;
  case CMP0106:
    pcStack_10 = "3.18.0";
    break;
  case CMP0107:
    pcStack_10 = "3.18.0";
    break;
  case CMP0108:
    pcStack_10 = "3.18.0";
    break;
  case CMP0109:
    pcStack_10 = "3.19.0";
    break;
  case CMP0110:
    pcStack_10 = "3.19.0";
    break;
  case CMP0111:
    pcStack_10 = "3.19.0";
    break;
  case CMP0112:
    pcStack_10 = "3.19.0";
    break;
  case CMP0113:
    pcStack_10 = "3.19.0";
    break;
  case CMP0114:
    pcStack_10 = "3.19.0";
    break;
  case CMP0115:
    pcStack_10 = "3.20.0";
    break;
  case CMP0116:
    pcStack_10 = "3.20.0";
    break;
  case CMP0117:
    pcStack_10 = "3.20.0";
    break;
  case CMP0118:
    pcStack_10 = "3.20.0";
    break;
  case CMP0119:
    pcStack_10 = "3.20.0";
    break;
  case CMP0120:
    pcStack_10 = "3.20.0";
    break;
  case CMP0121:
    pcStack_10 = "3.21.0";
    break;
  case CMP0122:
    pcStack_10 = "3.21.0";
    break;
  case CMP0123:
    pcStack_10 = "3.21.0";
    break;
  case CMP0124:
    pcStack_10 = "3.21.0";
    break;
  case CMP0125:
    pcStack_10 = "3.21.0";
    break;
  case CMP0126:
    pcStack_10 = "3.21.0";
    break;
  case CMP0127:
    pcStack_10 = "3.22.0";
    break;
  case CMP0128:
    pcStack_10 = "3.22.0";
    break;
  case CMP0129:
    pcStack_10 = "3.23.0";
    break;
  case CMP0130:
    pcStack_10 = "3.24.0";
    break;
  case CMP0131:
    pcStack_10 = "3.24.0";
    break;
  case CMP0132:
    pcStack_10 = "3.24.0";
    break;
  case CMP0133:
    pcStack_10 = "3.24.0";
    break;
  case CMP0134:
    pcStack_10 = "3.24.0";
    break;
  case CMP0135:
    pcStack_10 = "3.24.0";
    break;
  case CMP0136:
    pcStack_10 = "3.24.0";
    break;
  case CMP0137:
    pcStack_10 = "3.24.0";
    break;
  case CMP0138:
    pcStack_10 = "3.24.0";
    break;
  case CMP0139:
    pcStack_10 = "3.24.0";
    break;
  case CMP0140:
    pcStack_10 = "3.25.0";
    break;
  case CMP0141:
    pcStack_10 = "3.25.0";
    break;
  case CMP0142:
    pcStack_10 = "3.25.0";
    break;
  case CMPCOUNT:
    pcStack_10 = (char *)0x0;
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* idToVersion(cmPolicies::PolicyID id)
{
  switch (id) {
#define POLICY_CASE(ID, V_MAJOR, V_MINOR, V_PATCH)                            \
  case cmPolicies::ID:                                                        \
    return #V_MAJOR "." #V_MINOR "." #V_PATCH;
    // NOLINTNEXTLINE(bugprone-branch-clone)
    CM_FOR_EACH_POLICY_ID_VERSION(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return nullptr;
  }
  return nullptr;
}